

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

boolean diseasemu(permonst *mdat)

{
  boolean bVar1;
  schar sVar2;
  char *cause;
  uint uVar3;
  
  if (((u.uprops[0x34].intrinsic == 0) &&
      (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
     (bVar1 = defends(0x21,uwep), bVar1 == '\0')) {
    if (u.uprops[0x1d].intrinsic == 0) {
      sVar2 = acurr(4);
      uVar3 = mt_random();
      uVar3 = SUB164(ZEXT416(uVar3) % SEXT816((long)sVar2),0) + 0x14;
    }
    else {
      uVar3 = u.uprops[0x1d].intrinsic / 3 + 1;
    }
    cause = mons_mname(mdat);
    make_sick((ulong)uVar3,cause,'\x01',2);
    return '\x01';
  }
  pline("You feel a slight illness.");
  return '\0';
}

Assistant:

static boolean diseasemu(const struct permonst *mdat)
{
	if (Sick_resistance) {
		pline("You feel a slight illness.");
		return FALSE;
	} else {
		make_sick(Sick ? Sick/3L + 1L : (long)rn1(ACURR(A_CON), 20),
			mons_mname(mdat), TRUE, SICK_NONVOMITABLE);
		return TRUE;
	}
}